

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTargetLinkLibrariesCommand.h
# Opt level: O0

cmCommand * __thiscall cmTargetLinkLibrariesCommand::Clone(cmTargetLinkLibrariesCommand *this)

{
  cmTargetLinkLibrariesCommand *this_00;
  cmTargetLinkLibrariesCommand *this_local;
  
  this_00 = (cmTargetLinkLibrariesCommand *)operator_new(0x40);
  cmTargetLinkLibrariesCommand(this_00);
  return &this_00->super_cmCommand;
}

Assistant:

cmCommand* Clone() override { return new cmTargetLinkLibrariesCommand; }